

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.hpp
# Opt level: O1

bool __thiscall
soplex::SPxFastRT<double>::maxReEnter
          (SPxFastRT<double> *this,double *sel,double maxabs,SPxId *id,int nr,bool polish)

{
  Representation RVar1;
  SPxSolverBase<double> *pSVar2;
  UpdateVector<double> *pUVar3;
  UpdateVector<double> *pUVar4;
  Item *pIVar5;
  pointer pdVar6;
  pointer pdVar7;
  VectorBase<double> *pVVar8;
  int iVar9;
  int iVar10;
  VectorBase<double> *pVVar11;
  Nonzero<double> *pNVar12;
  VectorBase<double> *pVVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  pSVar2 = (this->super_SPxRatioTester<double>).thesolver;
  pUVar3 = pSVar2->thePvec;
  pUVar4 = pSVar2->theCoPvec;
  RVar1 = pSVar2->theRep;
  iVar9 = (id->super_DataKey).info * RVar1;
  if (iVar9 < 0) {
    if (0 < RVar1 * ((pSVar2->super_SPxBasisBase<double>).thedesc.costat)->data[nr]) {
      SSVectorBase<double>::clearIdx(&pUVar4->thedelta,nr);
      return true;
    }
    pVVar13 = pSVar2->theCoUbound;
    pVVar11 = pSVar2->theCoLbound;
    dVar15 = (pUVar4->super_VectorBase<double>).val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[nr];
    dVar14 = (pUVar4->thedelta).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[nr];
  }
  else {
    if (iVar9 == 0) {
      return true;
    }
    pIVar5 = (pSVar2->thevectors->set).theitem;
    iVar9 = (pSVar2->thevectors->set).thekey[nr].idx;
    iVar10 = pIVar5[iVar9].data.super_SVectorBase<double>.memused;
    if (iVar10 < 1) {
      dVar15 = 0.0;
    }
    else {
      pNVar12 = pIVar5[iVar9].data.super_SVectorBase<double>.m_elem;
      iVar10 = iVar10 + 1;
      dVar16 = 0.0;
      dVar14 = 0.0;
      do {
        dVar17 = pNVar12->val *
                 (pUVar4->super_VectorBase<double>).val.
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start[pNVar12->idx];
        dVar15 = dVar14 + dVar17;
        dVar16 = dVar16 + (dVar17 - (dVar15 - dVar14)) + (dVar14 - (dVar15 - (dVar15 - dVar14)));
        pNVar12 = pNVar12 + 1;
        iVar10 = iVar10 + -1;
        dVar14 = dVar15;
      } while (1 < iVar10);
      dVar15 = dVar15 + dVar16;
    }
    pVVar13 = pSVar2->theUbound;
    pVVar11 = pSVar2->theLbound;
    (pUVar3->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
    _M_impl.super__Vector_impl_data._M_start[nr] = dVar15;
    if (0 < RVar1 * ((pSVar2->super_SPxBasisBase<double>).thedesc.stat)->data[nr]) {
      SSVectorBase<double>::clearIdx(&pUVar3->thedelta,nr);
      return true;
    }
    dVar14 = (pUVar3->thedelta).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start[nr];
  }
  pVVar8 = pVVar13;
  if (dVar14 < 0.0) {
    pVVar8 = pVVar11;
  }
  *sel = ((pVVar8->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[nr] - dVar15) / dVar14;
  pdVar6 = (pVVar13->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (pVVar11->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((pdVar6[nr] != pdVar7[nr]) || (NAN(pdVar6[nr]) || NAN(pdVar7[nr]))) {
    dVar16 = -this->fastDelta / maxabs;
    if ((*sel <= dVar16 && dVar16 != *sel) && (*sel = 0.0, !polish)) {
      if (dVar14 <= 0.0) {
        pSVar2->theShift = pSVar2->theShift + pdVar7[nr];
        pdVar7[nr] = dVar15;
        pSVar2->theShift = pSVar2->theShift - dVar15;
      }
      else {
        pSVar2->theShift = pSVar2->theShift - pdVar6[nr];
        pdVar6[nr] = dVar15;
        pSVar2->theShift = dVar15 + pSVar2->theShift;
      }
    }
  }
  else {
    *sel = 0.0;
    if (!polish) {
      if (dVar15 <= pdVar6[nr]) {
        pSVar2->theShift = (pdVar7[nr] - dVar15) + pSVar2->theShift;
      }
      else {
        pSVar2->theShift = (dVar15 - pdVar6[nr]) + pSVar2->theShift;
      }
      pdVar7[nr] = dVar15;
      pdVar6[nr] = dVar15;
    }
  }
  return false;
}

Assistant:

bool SPxFastRT<R>::maxReEnter(R& sel,
                              R maxabs,
                              const SPxId& id,
                              int nr,
                              bool polish)
{
   R x, d;
   VectorBase<R>* up;
   VectorBase<R>* low;

   UpdateVector<R>& pvec = this->thesolver->pVec();
   SSVectorBase<R>& pupd = this->thesolver->pVec().delta();
   VectorBase<R>& upb = this->thesolver->upBound();
   VectorBase<R>& lpb = this->thesolver->lpBound();
   UpdateVector<R>& cvec = this->thesolver->coPvec();
   SSVectorBase<R>& cupd = this->thesolver->coPvec().delta();
   VectorBase<R>& ucb = this->thesolver->ucBound();
   VectorBase<R>& lcb = this->thesolver->lcBound();

   if(this->thesolver->isCoId(id))
   {
      if(this->thesolver->isCoBasic(nr))
      {
         cupd.clearIdx(nr);
         return true;
      }

      x = cvec[nr];
      d = cupd[nr];
      up = &ucb;
      low = &lcb;

      if(d < 0.0)
         sel = (lcb[nr] - cvec[nr]) / d;
      else
         sel = (ucb[nr] - cvec[nr]) / d;
   }
   else if(this->thesolver->isId(id))
   {
      pvec[nr] = this->thesolver->vector(nr) * cvec;

      if(this->thesolver->isBasic(nr))
      {
         pupd.clearIdx(nr);
         return true;
      }

      x = pvec[nr];
      d = pupd[nr];
      up = &upb;
      low = &lpb;

      if(d < 0.0)
         sel = (lpb[nr] - pvec[nr]) / d;
      else
         sel = (upb[nr] - pvec[nr]) / d;
   }
   else
      return true;

   if((*up)[nr] != (*low)[nr])
   {
      if(sel < -fastDelta / maxabs)
      {
         sel = 0.0;

         // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
         if(!polish)
         {
            if(d > 0.0)
            {
               this->thesolver->theShift -= (*up)[nr];
               (*up)[nr] = x;
               this->thesolver->theShift += (*up)[nr];
            }
            else
            {
               this->thesolver->theShift += (*low)[nr];
               (*low)[nr] = x;
               this->thesolver->theShift -= (*low)[nr];
            }
         }
      }
   }
   else
   {
      sel = 0.0;

      // prevent shifts in polishing mode to avoid a final cleanup step (i.e. simplex type switch)
      if(!polish)
      {
         if(x > (*up)[nr])
            this->thesolver->theShift += x - (*up)[nr];
         else
            this->thesolver->theShift += (*low)[nr] - x;

         (*up)[nr] = (*low)[nr] = x;
      }
   }

   return false;
}